

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.c++
# Opt level: O1

void __thiscall kj::Thread::sendSignal(Thread *this,int signo)

{
  int iVar1;
  Fault f;
  Fault local_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  iVar1 = pthread_kill(this->threadId,signo);
  if (iVar1 != 0) {
    local_20.exception = (Exception *)0x0;
    local_18 = 0;
    uStack_10 = 0;
    kj::_::Debug::Fault::init
              (&local_20,
               (EVP_PKEY_CTX *)
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/thread.c++"
              );
    kj::_::Debug::Fault::~Fault(&local_20);
  }
  return;
}

Assistant:

void Thread::sendSignal(int signo) {
  int pthreadResult = pthread_kill(*reinterpret_cast<pthread_t*>(&threadId), signo);
  if (pthreadResult != 0) {
    KJ_FAIL_SYSCALL("pthread_kill", pthreadResult) { break; }
  }
}